

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall Fl_Text_Display::draw_range(Fl_Text_Display *this,int startpos,int endpos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  int iVar5;
  int pos;
  int startLine;
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar2 = Fl_Text_Buffer::utf8_align(this->mBuffer,startpos);
  iVar3 = Fl_Text_Buffer::utf8_align(this->mBuffer,endpos);
  iVar4 = this->mFirstChar;
  if ((iVar4 <= iVar3) &&
     ((iVar2 <= this->mLastChar ||
      ((0 < (long)this->mNVisibleLines && (this->mLineStarts[(long)this->mNVisibleLines + -1] == -1)
       ))))) {
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    iVar5 = this->mBuffer->mLength;
    if (iVar5 <= iVar2) {
      iVar2 = iVar5;
    }
    pos = 0;
    if (0 < iVar3) {
      pos = iVar3;
    }
    if (iVar5 <= pos) {
      pos = iVar5;
    }
    if (iVar2 <= iVar4) {
      iVar2 = iVar4;
    }
    iVar4 = position_to_line(this,iVar2,(int *)&local_38);
    if (iVar4 == 0) {
      local_38 = CONCAT44(local_38._4_4_,this->mNVisibleLines + -1);
    }
    if ((pos < this->mLastChar) &&
       (iVar4 = position_to_line(this,pos,(int *)((long)&local_38 + 4)), iVar4 != 0)) {
      iVar4 = local_38._4_4_;
    }
    else {
      iVar4 = this->mNVisibleLines + -1;
    }
    iVar5 = (int)local_38;
    iVar3 = this->mLineStarts[(int)local_38];
    iVar2 = iVar2 - iVar3;
    if (iVar3 == -1) {
      iVar2 = 0;
    }
    iVar3 = 0x7fffffff;
    if ((pos < this->mLastChar) &&
       (iVar1 = this->mLineStarts[iVar4], iVar3 = pos - iVar1, iVar1 == -1)) {
      iVar3 = 0;
    }
    if ((int)local_38 != iVar4) {
      draw_vline(this,(int)local_38,0,0x7fffffff,iVar2,0x7fffffff);
      while (iVar5 = iVar5 + 1, iVar5 < iVar4) {
        draw_vline(this,iVar5,0,0x7fffffff,0,0x7fffffff);
      }
      iVar2 = 0;
    }
    draw_vline(this,iVar4,0,0x7fffffff,iVar2,iVar3);
    return;
  }
  return;
}

Assistant:

void Fl_Text_Display::draw_range(int startpos, int endpos) {
  startpos = buffer()->utf8_align(startpos);
  endpos = buffer()->utf8_align(endpos);

  int i, startLine, lastLine, startIndex, endIndex;

  /* If the range is outside of the displayed text, just return */
  if ( endpos < mFirstChar || ( startpos > mLastChar && !empty_vlines() ) )
    return;

  /* Clean up the starting and ending values */
  if ( startpos < 0 ) startpos = 0;
  if ( startpos > mBuffer->length() ) startpos = mBuffer->length();
  if ( endpos < 0 ) endpos = 0;
  if ( endpos > mBuffer->length() ) endpos = mBuffer->length();

  /* Get the starting and ending lines */
  if ( startpos < mFirstChar )
    startpos = mFirstChar;
  if ( !position_to_line( startpos, &startLine ) )
    startLine = mNVisibleLines - 1;
  if ( endpos >= mLastChar ) {
    lastLine = mNVisibleLines - 1;
  } else {
    if ( !position_to_line( endpos, &lastLine ) ) {
      /* shouldn't happen */
      lastLine = mNVisibleLines - 1;
    }
  }

  /* Get the starting and ending positions within the lines */
  startIndex = mLineStarts[ startLine ] == -1 ? 0 : startpos - mLineStarts[ startLine ];
  if ( endpos >= mLastChar )
    endIndex = INT_MAX;
  else if ( mLineStarts[ lastLine ] == -1 )
    endIndex = 0;
  else
    endIndex = endpos - mLineStarts[ lastLine ];

  /* If the starting and ending lines are the same, redisplay the single
   line between "start" and "end" */
  if ( startLine == lastLine ) {
    draw_vline( startLine, 0, INT_MAX, startIndex, endIndex );
    return;
  }

  /* Redisplay the first line from "start" */
  draw_vline( startLine, 0, INT_MAX, startIndex, INT_MAX );

  /* Redisplay the lines in between at their full width */
  for ( i = startLine + 1; i < lastLine; i++ )
    draw_vline( i, 0, INT_MAX, 0, INT_MAX );

  /* Redisplay the last line to "end" */
  draw_vline( lastLine, 0, INT_MAX, 0, endIndex );
}